

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O1

void __thiscall QMakeProject::dump(QMakeProject *this)

{
  QString *pQVar1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_node_base *p_Var4;
  long lVar5;
  QArrayData *__s;
  long lVar6;
  ProString *v;
  ProString *val;
  long in_FS_OFFSET;
  QString local_b8;
  QStringBuilder<char,_QString> local_98;
  QString local_78;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)0x0;
  local_58.size = 0;
  lVar5 = (long)(this->super_QMakeEvaluator).m_valuemapStack.
                super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                .
                super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                ._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
  if (lVar5 == 0) {
    p_Var3 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var3 = *(_Rb_tree_node_base **)(lVar5 + 0x20);
  }
  lVar5 = (long)(this->super_QMakeEvaluator).m_valuemapStack.
                super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                .
                super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                ._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
  p_Var4 = (_Rb_tree_node_base *)(lVar5 + 0x10);
  if (lVar5 == 0) {
    p_Var4 = (_Rb_tree_node_base *)0x0;
  }
  if (p_Var3 != p_Var4) {
    do {
      bVar2 = ProString::startsWith((ProString *)(p_Var3 + 1),(QChar)0x2e,CaseSensitive);
      if (!bVar2) {
        local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.b.d.d = (Data *)0x2a6add;
        local_98._0_8_ = (ProString *)(p_Var3 + 1);
        QStringBuilder<const_ProKey_&,_const_char_(&)[3]>::convertTo<QString>
                  (&local_78,(QStringBuilder<const_ProKey_&,_const_char_(&)[3]> *)&local_98);
        if (*(long *)(p_Var3 + 3) != 0) {
          val = (ProString *)p_Var3[2]._M_right;
          lVar5 = *(long *)(p_Var3 + 3) * 0x30;
          do {
            QMakeEvaluator::formatValue(&local_b8,val,false);
            local_98.b.d.size = local_b8.d.size;
            local_98.b.d.ptr = local_b8.d.ptr;
            local_98.b.d.d = local_b8.d.d;
            local_98.a = 0x20;
            local_b8.d.d = (Data *)0x0;
            local_b8.d.ptr = (char16_t *)0x0;
            local_b8.d.size = 0;
            ::operator+=(&local_78,&local_98);
            if (&(local_98.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_98.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_98.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                   + -1;
              UNLOCK();
              if (((local_98.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                  == 0) {
                QArrayData::deallocate(&(local_98.b.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
              }
            }
            val = val + 1;
            lVar5 = lVar5 + -0x30;
          } while (lVar5 != 0);
        }
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)&local_58,local_58.size,&local_78);
        QList<QString>::end((QList<QString> *)&local_58);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
      lVar5 = (long)(this->super_QMakeEvaluator).m_valuemapStack.
                    super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                    .
                    super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
      p_Var4 = (_Rb_tree_node_base *)(lVar5 + 0x10);
      if (lVar5 == 0) {
        p_Var4 = (_Rb_tree_node_base *)0x0;
      }
    } while (p_Var3 != p_Var4);
  }
  QtPrivate::QStringList_sort((QList *)&local_58,CaseSensitive);
  pQVar1 = local_58.ptr;
  if (local_58.size != 0) {
    lVar5 = local_58.size * 0x18;
    lVar6 = 0;
    do {
      QString::toLocal8Bit_helper((QChar *)&local_98,*(longlong *)((long)&(pQVar1->d).ptr + lVar6));
      __s = &(local_98.b.d.d)->super_QArrayData;
      if (&(local_98.b.d.d)->super_QArrayData == (QArrayData *)0x0) {
        __s = (QArrayData *)&QByteArray::_empty;
      }
      puts((char *)__s);
      if ((ProString *)local_98._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_98._0_8_)->d).d =
             *(int *)&(((QString *)local_98._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_98._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_98._0_8_,1,0x10);
        }
      }
      lVar6 = lVar6 + 0x18;
    } while (lVar5 != lVar6);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMakeProject::dump() const
{
    QStringList out;
    for (ProValueMap::ConstIterator it = m_valuemapStack.front().begin();
         it != m_valuemapStack.front().end(); ++it) {
        if (!it.key().startsWith('.')) {
            QString str = it.key() + " =";
            for (const ProString &v : it.value())
                str += ' ' + formatValue(v);
            out << str;
        }
    }
    out.sort();
    for (const QString &v : std::as_const(out))
        puts(qPrintable(v));
}